

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  yoml_t *node;
  SSL_CTX **contexts;
  bool bVar1;
  undefined4 uVar2;
  __uid_t _Var3;
  int iVar4;
  uint uVar5;
  int iVar6;
  pid_t pVar7;
  int extraout_EAX;
  passwd *ppVar8;
  h2o_configurator_t *phVar9;
  yoml_t *pyVar10;
  time_t tVar11;
  FILE *pFVar12;
  anon_struct_968_4_e2476a95 *paVar13;
  ulong uVar14;
  h2o_vector_t *vector;
  size_t sVar15;
  void *pvVar16;
  char **__s;
  char *pcVar17;
  char *__s1;
  char *pcVar18;
  size_t sVar19;
  long *plVar20;
  long lVar21;
  resolve_tag_node_cache_entry_t *prVar22;
  h2o_iovec_t hVar23;
  yoml_parse_args_t yStack_e0;
  option *poStack_c0;
  char *pcStack_b8;
  char *pcStack_b0;
  char **ppcStack_a8;
  ulong uStack_a0;
  code *pcStack_98;
  code *pcStack_90;
  char *pcStack_88;
  resolve_tag_arg_t resolve_tag_arg;
  undefined1 auStack_68 [8];
  yoml_parse_args_t parse_args;
  int local_3c;
  int local_38;
  int pipefds [2];
  
  __s = &pcStack_88;
  resolve_tag_arg.node_cache.capacity = (size_t)*argv;
  pcStack_90 = (code *)0x18d0d3;
  pipefds[0] = argc;
  conf.num_threads = h2o_numproc();
  conf.tfo_queues = 0x1000;
  pcStack_90 = (code *)0x18d0f2;
  conf.launch_time = time((time_t *)0x0);
  h2o_hostinfo_max_threads = 0x20;
  pcStack_90 = (code *)0x18d118;
  h2o_sem_init(&ocsp_updater_semaphore,10);
  pcStack_90 = (code *)0x18d11d;
  init_openssl();
  pcStack_90 = (code *)0x18d125;
  h2o_config_init(&conf.globalconf);
  pcStack_90 = (code *)0x18d12a;
  _Var3 = getuid();
  if (_Var3 == 0) {
    pcStack_90 = (code *)0x18d13d;
    ppVar8 = getpwnam("nobody");
    if (ppVar8 != (passwd *)0x0) {
      conf.globalconf.user = "nobody";
    }
  }
  pcStack_90 = (code *)0x18d15d;
  phVar9 = h2o_configurator_create(&conf.globalconf,0x40);
  phVar9->enter = on_config_listen_enter;
  phVar9->exit = on_config_listen_exit;
  pcStack_90 = (code *)0x18d18e;
  h2o_configurator_define_command(phVar9,"listen",3,on_config_listen);
  pcStack_90 = (code *)0x18d19b;
  phVar9 = h2o_configurator_create(&conf.globalconf,0x40);
  pcStack_90 = (code *)0x18d1b9;
  h2o_configurator_define_command(phVar9,"user",0x101,on_config_user);
  pcStack_90 = (code *)0x18d1d4;
  h2o_configurator_define_command(phVar9,"pid-file",0x101,on_config_pid_file);
  pcStack_90 = (code *)0x18d1ef;
  h2o_configurator_define_command(phVar9,"error-log",0x101,on_config_error_log);
  pcStack_90 = (code *)0x18d20a;
  h2o_configurator_define_command(phVar9,"max-connections",1,on_config_max_connections);
  pcStack_90 = (code *)0x18d225;
  h2o_configurator_define_command(phVar9,"num-threads",1,on_config_num_threads);
  pcStack_90 = (code *)0x18d240;
  h2o_configurator_define_command
            (phVar9,"num-name-resolution-threads",1,on_config_num_name_resolution_threads);
  pcStack_90 = (code *)0x18d25b;
  h2o_configurator_define_command(phVar9,"tcp-fastopen",1,on_config_tcp_fastopen);
  pcStack_90 = (code *)0x18d276;
  h2o_configurator_define_command
            (phVar9,"ssl-session-resumption",0x401,ssl_session_resumption_on_config);
  pcStack_90 = (code *)0x18d291;
  h2o_configurator_define_command(phVar9,"num-ocsp-updaters",0x101,on_config_num_ocsp_updaters);
  pcStack_90 = (code *)0x18d2ac;
  h2o_configurator_define_command(phVar9,"temp-buffer-path",0x101,on_config_temp_buffer_path);
  pcStack_90 = (code *)0x18d2c7;
  h2o_configurator_define_command(phVar9,"crash-handler",0x101,on_config_crash_handler);
  pcStack_90 = (code *)0x18d2e2;
  h2o_configurator_define_command
            (phVar9,"crash-handler.wait-pipe-close",0x101,on_config_crash_handler_wait_pipe_close);
  pcStack_90 = (code *)0x18d2ea;
  h2o_access_log_register_configurator(&conf.globalconf);
  pcStack_90 = (code *)0x18d2f2;
  h2o_compress_register_configurator(&conf.globalconf);
  pcStack_90 = (code *)0x18d2fa;
  h2o_expires_register_configurator(&conf.globalconf);
  pcStack_90 = (code *)0x18d302;
  h2o_errordoc_register_configurator(&conf.globalconf);
  pcStack_90 = (code *)0x18d30a;
  h2o_fastcgi_register_configurator(&conf.globalconf);
  pcStack_90 = (code *)0x18d312;
  h2o_file_register_configurator(&conf.globalconf);
  pcStack_90 = (code *)0x18d31a;
  h2o_throttle_resp_register_configurator(&conf.globalconf);
  pcStack_90 = (code *)0x18d322;
  h2o_headers_register_configurator(&conf.globalconf);
  pcStack_90 = (code *)0x18d32a;
  h2o_proxy_register_configurator(&conf.globalconf);
  pcStack_90 = (code *)0x18d332;
  h2o_reproxy_register_configurator(&conf.globalconf);
  pcStack_90 = (code *)0x18d33a;
  h2o_redirect_register_configurator(&conf.globalconf);
  pcStack_90 = (code *)0x18d342;
  h2o_status_register_configurator(&conf.globalconf);
  pcStack_90 = (code *)0x18d34a;
  h2o_http2_debug_state_register_configurator(&conf.globalconf);
  pcStack_90 = (code *)0x18d365;
  hVar23.len = 4;
  hVar23.base = "main";
  h2o_config_register_simple_status_handler(&conf.globalconf,hVar23,on_extra_status);
  uVar14 = (ulong)(uint)pipefds[0];
  pcVar17 = "etc/h2o.conf";
LAB_0018d37e:
  do {
    do {
      while( true ) {
        pcStack_90 = (code *)0x18d392;
        iVar4 = getopt_long(uVar14,argv,"c:m:tvh",main::longopts,0);
        pcVar18 = _optarg;
        if (0x6c < iVar4) break;
        if (iVar4 < 0x3f) {
          if (iVar4 == -1) {
            pcStack_90 = (code *)0x18d4b4;
            conf.server_starter.num_fds = h2o_server_starter_get_fds(&conf.server_starter.fds);
            __s = &pcStack_88;
            if (conf.server_starter.num_fds != 0xffffffffffffffff) {
              __s = &pcStack_88;
              if (conf.server_starter.fds != (int *)0x0) {
                if (conf.server_starter.num_fds != 0) {
                  sVar15 = 0;
                  do {
                    pcStack_90 = (code *)0x18d4ec;
                    set_cloexec(conf.server_starter.fds[sVar15]);
                    sVar15 = sVar15 + 1;
                  } while (sVar15 != conf.server_starter.num_fds);
                }
                lVar21 = -(conf.server_starter.num_fds + 0xf & 0xfffffffffffffff0);
                __s = (char **)((long)&pcStack_88 + lVar21);
                *(undefined8 *)((long)&pcStack_90 + lVar21) = 0x18d51a;
                conf.server_starter.bound_fd_map = (char *)__s;
                memset(__s,0,conf.server_starter.num_fds);
                *(undefined8 *)((long)&pcStack_90 + lVar21) = 0x18d526;
                conf.server_starter.env_var = getenv("SERVER_STARTER_PORT");
              }
              *(char *)((long)__s + -8) = '9';
              *(char *)((long)__s + -7) = -0x2b;
              *(char *)((long)__s + -6) = '\x18';
              *(char *)((long)__s + -5) = '\0';
              *(char *)((long)__s + -4) = '\0';
              *(char *)((long)__s + -3) = '\0';
              *(char *)((long)__s + -2) = '\0';
              *(char *)((long)__s + -1) = '\0';
              unsetenv("SERVER_STARTER_PORT");
              parse_args.resolve_tag.cb =
                   (_func_yoml_t_ptr_char_ptr_yoml_t_ptr_void_ptr *)&pcStack_88;
              resolve_tag_arg.node_cache.size = 0;
              pcStack_88 = (char *)0x0;
              resolve_tag_arg.node_cache.entries = (resolve_tag_node_cache_entry_t *)0x0;
              auStack_68._0_4_ = SUB84(pcVar17,0);
              auStack_68._4_4_ = (undefined4)((ulong)pcVar17 >> 0x20);
              parse_args.filename._0_4_ = 0;
              parse_args.filename._4_4_ = 0;
              parse_args.mem_set._0_4_ = 0x18dc07;
              parse_args.mem_set._4_4_ = 0;
              *(char *)((long)__s + -8) = 'j';
              *(char *)((long)__s + -7) = -0x2b;
              *(char *)((long)__s + -6) = '\x18';
              *(char *)((long)__s + -5) = '\0';
              *(char *)((long)__s + -4) = '\0';
              *(char *)((long)__s + -3) = '\0';
              *(char *)((long)__s + -2) = '\0';
              *(char *)((long)__s + -1) = '\0';
              pyVar10 = load_config((yoml_parse_args_t *)auStack_68,(yoml_t *)0x0);
              if (pyVar10 != (yoml_t *)0x0) {
                *(char *)((long)__s + -8) = -0x6f;
                *(char *)((long)__s + -7) = -0x2b;
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                iVar4 = h2o_configurator_apply
                                  (&conf.globalconf,pyVar10,(uint)(conf.run_mode != RUN_MODE_WORKER)
                                  );
                if (iVar4 != 0) goto LAB_0018db97;
                if (resolve_tag_arg.node_cache.entries != (resolve_tag_node_cache_entry_t *)0x0) {
                  lVar21 = 0x10;
                  prVar22 = (resolve_tag_node_cache_entry_t *)0x0;
                  do {
                    pcVar18 = pcStack_88;
                    pvVar16 = *(void **)(pcStack_88 + lVar21 + -0x10);
                    *(char *)((long)__s + -8) = -0x49;
                    *(char *)((long)__s + -7) = -0x2b;
                    *(char *)((long)__s + -6) = '\x18';
                    *(char *)((long)__s + -5) = '\0';
                    *(char *)((long)__s + -4) = '\0';
                    *(char *)((long)__s + -3) = '\0';
                    *(char *)((long)__s + -2) = '\0';
                    *(char *)((long)__s + -1) = '\0';
                    free(pvVar16);
                    node = *(yoml_t **)(pcVar18 + lVar21);
                    *(char *)((long)__s + -8) = -0x3e;
                    *(char *)((long)__s + -7) = -0x2b;
                    *(char *)((long)__s + -6) = '\x18';
                    *(char *)((long)__s + -5) = '\0';
                    *(char *)((long)__s + -4) = '\0';
                    *(char *)((long)__s + -3) = '\0';
                    *(char *)((long)__s + -2) = '\0';
                    *(char *)((long)__s + -1) = '\0';
                    yoml_free(node,(_func_void_ptr_void_ptr_int_size_t *)0x0);
                    prVar22 = (resolve_tag_node_cache_entry_t *)
                              ((long)&(prVar22->filename).base + 1);
                    lVar21 = lVar21 + 0x18;
                  } while (prVar22 != resolve_tag_arg.node_cache.entries);
                }
                pcVar18 = pcStack_88;
                *(char *)((long)__s + -8) = -0x28;
                *(char *)((long)__s + -7) = -0x2b;
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                free(pcVar18);
                *(char *)((long)__s + -8) = -0x1b;
                *(char *)((long)__s + -7) = -0x2b;
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                yoml_free(pyVar10,(_func_void_ptr_void_ptr_int_size_t *)0x0);
                conf.globalconf.filecache.capacity =
                     conf.globalconf.http2.max_concurrent_requests_per_connection * 2;
                if (conf.server_starter.fds != (int *)0x0) {
                  if (conf.server_starter.num_fds == 0) {
                    bVar1 = false;
                  }
                  else {
                    bVar1 = true;
                    sVar15 = 0;
                    do {
                      if (conf.server_starter.bound_fd_map[sVar15] == '\0') {
                        *(char *)((long)__s + -8) = '7';
                        *(char *)((long)__s + -7) = -0x2a;
                        *(char *)((long)__s + -6) = '\x18';
                        *(char *)((long)__s + -5) = '\0';
                        *(char *)((long)__s + -4) = '\0';
                        *(char *)((long)__s + -3) = '\0';
                        *(char *)((long)__s + -2) = '\0';
                        *(char *)((long)__s + -1) = '\0';
                        main_cold_2();
                        bVar1 = false;
                      }
                      sVar15 = sVar15 + 1;
                    } while (sVar15 != conf.server_starter.num_fds);
                    bVar1 = !bVar1;
                  }
                  if (bVar1) {
                    *(char *)((long)__s + -8) = -0x5b;
                    *(char *)((long)__s + -7) = -0x29;
                    *(char *)((long)__s + -6) = '\x18';
                    *(char *)((long)__s + -5) = '\0';
                    *(char *)((long)__s + -4) = '\0';
                    *(char *)((long)__s + -3) = '\0';
                    *(char *)((long)__s + -2) = '\0';
                    *(char *)((long)__s + -1) = '\0';
                    main_cold_3();
                    return 0x4e;
                  }
                }
                *(char *)((long)__s + -8) = '[';
                *(char *)((long)__s + -7) = -0x2a;
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                tVar11 = time((time_t *)0x0);
                *(char *)((long)__s + -8) = 'c';
                *(char *)((long)__s + -7) = -0x2a;
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                uVar5 = getpid();
                *(char *)((long)__s + -8) = 'l';
                *(char *)((long)__s + -7) = -0x2a;
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                srand((uint)tVar11 ^ uVar5);
                sVar15 = resolve_tag_arg.node_cache.capacity;
                if (conf.run_mode == RUN_MODE_MASTER) {
LAB_0018d68f:
                  *(char *)((long)__s + -8) = -0x65;
                  *(char *)((long)__s + -7) = -0x2a;
                  *(char *)((long)__s + -6) = '\x18';
                  *(char *)((long)__s + -5) = '\0';
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  run_using_server_starter((char *)sVar15,pcVar17);
                  return 0x4e;
                }
                if (conf.run_mode == RUN_MODE_TEST) {
                  *(char *)((long)__s + -8) = -0x4e;
                  *(char *)((long)__s + -7) = -0x2a;
                  *(char *)((long)__s + -6) = '\x18';
                  *(char *)((long)__s + -5) = '\0';
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  puts("configuration OK");
                  return 0;
                }
                if (conf.run_mode == RUN_MODE_DAEMON) {
                  if (conf.error_log == (char *)0x0) {
                    *(char *)((long)__s + -8) = -0x4b;
                    *(char *)((long)__s + -7) = -0x29;
                    *(char *)((long)__s + -6) = '\x18';
                    *(char *)((long)__s + -5) = '\0';
                    *(char *)((long)__s + -4) = '\0';
                    *(char *)((long)__s + -3) = '\0';
                    *(char *)((long)__s + -2) = '\0';
                    *(char *)((long)__s + -1) = '\0';
                    main_cold_4();
                    return 0x4e;
                  }
                  goto LAB_0018d68f;
                }
                *(char *)((long)__s + -8) = -0x3a;
                *(char *)((long)__s + -7) = -0x2a;
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                pcVar17 = getenv("H2O_VIA_MASTER");
                if (pcVar17 != (char *)0x0) {
                  conf.pid_file = (char *)0x0;
                  conf.error_log = (char *)0x0;
                }
                *(char *)((long)__s + -8) = -0x1d;
                *(char *)((long)__s + -7) = -0x2a;
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                iVar4 = getrlimit(RLIMIT_NOFILE,(rlimit *)auStack_68);
                if (iVar4 == 0) {
                  auStack_68._0_4_ = (int)parse_args.filename;
                  auStack_68._4_4_ = parse_args.filename._4_4_;
                  *(char *)((long)__s + -8) = -4;
                  *(char *)((long)__s + -7) = -0x2a;
                  *(char *)((long)__s + -6) = '\x18';
                  *(char *)((long)__s + -5) = '\0';
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  iVar4 = setrlimit(RLIMIT_NOFILE,(rlimit *)auStack_68);
                  if (iVar4 == 0) {
                    *(char *)((long)__s + -8) = -0x50;
                    *(char *)((long)__s + -7) = -0x26;
                    *(char *)((long)__s + -6) = '\x18';
                    *(char *)((long)__s + -5) = '\0';
                    *(char *)((long)__s + -4) = '\0';
                    *(char *)((long)__s + -3) = '\0';
                    *(char *)((long)__s + -2) = '\0';
                    *(char *)((long)__s + -1) = '\0';
                    main_cold_5();
                  }
                }
                *(char *)((long)__s + -8) = '\x15';
                *(char *)((long)__s + -7) = -0x29;
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                h2o_set_signal_handler(0xf,on_sigterm);
                *(char *)((long)__s + -8) = '$';
                *(char *)((long)__s + -7) = -0x29;
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                h2o_set_signal_handler(0xd,(_func_void_int *)0x1);
                *(char *)((long)__s + -8) = '0';
                *(char *)((long)__s + -7) = -0x29;
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                pcVar17 = h2o_configurator_get_cmd_path(conf.crash_handler);
                resolve_tag_arg.node_cache.entries = (resolve_tag_node_cache_entry_t *)0x0;
                pcStack_88 = pcVar17;
                *(char *)((long)__s + -8) = 'H';
                *(char *)((long)__s + -7) = -0x29;
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                iVar6 = pipe(&local_3c);
                iVar4 = local_38;
                if (iVar6 == 0) {
                  *(char *)((long)__s + -8) = '`';
                  *(char *)((long)__s + -7) = -0x29;
                  *(char *)((long)__s + -6) = '\x18';
                  *(char *)((long)__s + -5) = '\0';
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  iVar4 = fcntl(iVar4,2,1);
                  if (iVar4 == -1) {
                    pcVar17 = "failed to set FD_CLOEXEC on pipefds[1]";
                    goto LAB_0018d7ca;
                  }
                  auStack_68._0_4_ = local_3c;
                  auStack_68._4_4_ = 0;
                  parse_args.filename._0_4_ = 2;
                  parse_args.filename._4_4_ = 1;
                  parse_args.mem_set._0_4_ = 0xffffffff;
                  *(char *)((long)__s + -8) = -0x79;
                  *(char *)((long)__s + -7) = -0x29;
                  *(char *)((long)__s + -6) = '\x18';
                  *(char *)((long)__s + -5) = '\0';
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  pVar7 = h2o_spawnp(pcVar17,&pcStack_88,(int *)auStack_68,0);
                  *(char *)((long)__s + -8) = -0x6f;
                  *(char *)((long)__s + -7) = -0x29;
                  *(char *)((long)__s + -6) = '\x18';
                  *(char *)((long)__s + -5) = '\0';
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  close(local_3c);
                  if (pVar7 == -1) {
                    *(char *)((long)__s + -8) = -0x62;
                    *(char *)((long)__s + -7) = -0x29;
                    *(char *)((long)__s + -6) = '\x18';
                    *(char *)((long)__s + -5) = '\0';
                    *(char *)((long)__s + -4) = '\0';
                    *(char *)((long)__s + -3) = '\0';
                    *(char *)((long)__s + -2) = '\0';
                    *(char *)((long)__s + -1) = '\0';
                    close(local_38);
                    goto LAB_0018d7cf;
                  }
                }
                else {
                  pcVar17 = "pipe failed";
LAB_0018d7ca:
                  *(char *)((long)__s + -8) = -0x31;
                  *(char *)((long)__s + -7) = -0x29;
                  *(char *)((long)__s + -6) = '\x18';
                  *(char *)((long)__s + -5) = '\0';
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  perror(pcVar17);
LAB_0018d7cf:
                  local_38 = -1;
                }
                crash_handler_fd = 2;
                if (local_38 != -1) {
                  crash_handler_fd = local_38;
                }
                *(char *)((long)__s + -8) = -7;
                *(char *)((long)__s + -7) = -0x29;
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                h2o_set_signal_handler(6,on_sigfatal);
                *(char *)((long)__s + -8) = '\x06';
                *(char *)((long)__s + -7) = -0x28;
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                h2o_set_signal_handler(7,on_sigfatal);
                *(char *)((long)__s + -8) = '\x13';
                *(char *)((long)__s + -7) = -0x28;
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                h2o_set_signal_handler(8,on_sigfatal);
                *(char *)((long)__s + -8) = ' ';
                *(char *)((long)__s + -7) = -0x28;
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                h2o_set_signal_handler(4,on_sigfatal);
                *(char *)((long)__s + -8) = '-';
                *(char *)((long)__s + -7) = -0x28;
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                h2o_set_signal_handler(0xb,on_sigfatal);
                if (conf.error_log == (char *)0x0) {
                  iVar4 = -1;
                }
                else {
                  *(char *)((long)__s + -8) = '>';
                  *(char *)((long)__s + -7) = -0x28;
                  *(char *)((long)__s + -6) = '\x18';
                  *(char *)((long)__s + -5) = '\0';
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  iVar4 = h2o_access_log_open_log(conf.error_log);
                  if (iVar4 == -1) {
                    return 0x4e;
                  }
                }
                *(char *)((long)__s + -8) = 'g';
                *(char *)((long)__s + -7) = -0x28;
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                setvbuf(_stdout,(char *)0x0,1,0);
                *(char *)((long)__s + -8) = '\x7f';
                *(char *)((long)__s + -7) = -0x28;
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                setvbuf(_stderr,(char *)0x0,1,0);
                if (conf.globalconf.user == (char *)0x0) {
                  *(char *)((long)__s + -8) = -0x38;
                  *(char *)((long)__s + -7) = -0x28;
                  *(char *)((long)__s + -6) = '\x18';
                  *(char *)((long)__s + -5) = '\0';
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  _Var3 = getuid();
                  if (_Var3 == 0) {
                    *(char *)((long)__s + -8) = -0x46;
                    *(char *)((long)__s + -7) = -0x26;
                    *(char *)((long)__s + -6) = '\x18';
                    *(char *)((long)__s + -5) = '\0';
                    *(char *)((long)__s + -4) = '\0';
                    *(char *)((long)__s + -3) = '\0';
                    *(char *)((long)__s + -2) = '\0';
                    *(char *)((long)__s + -1) = '\0';
                    main_cold_9();
                    return 0x4e;
                  }
                }
                else {
                  *(char *)((long)__s + -8) = -0x70;
                  *(char *)((long)__s + -7) = -0x28;
                  *(char *)((long)__s + -6) = '\x18';
                  *(char *)((long)__s + -5) = '\0';
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  iVar6 = h2o_setuidgid(conf.globalconf.user);
                  if (iVar6 != 0) {
                    *(char *)((long)__s + -8) = -0x6b;
                    *(char *)((long)__s + -7) = -0x26;
                    *(char *)((long)__s + -6) = '\x18';
                    *(char *)((long)__s + -5) = '\0';
                    *(char *)((long)__s + -4) = '\0';
                    *(char *)((long)__s + -3) = '\0';
                    *(char *)((long)__s + -2) = '\0';
                    *(char *)((long)__s + -1) = '\0';
                    main_cold_6();
                    return 0x47;
                  }
                  if (neverbleed != (neverbleed_t *)0x0) {
                    *(char *)((long)__s + -8) = -0x4b;
                    *(char *)((long)__s + -7) = -0x28;
                    *(char *)((long)__s + -6) = '\x18';
                    *(char *)((long)__s + -5) = '\0';
                    *(char *)((long)__s + -4) = '\0';
                    *(char *)((long)__s + -3) = '\0';
                    *(char *)((long)__s + -2) = '\0';
                    *(char *)((long)__s + -1) = '\0';
                    iVar6 = neverbleed_setuidgid(neverbleed,conf.globalconf.user,1);
                    if (iVar6 != 0) {
                      *(char *)((long)__s + -8) = -0x42;
                      *(char *)((long)__s + -7) = -0x28;
                      *(char *)((long)__s + -6) = '\x18';
                      *(char *)((long)__s + -5) = '\0';
                      *(char *)((long)__s + -4) = '\0';
                      *(char *)((long)__s + -3) = '\0';
                      *(char *)((long)__s + -2) = '\0';
                      *(char *)((long)__s + -1) = '\0';
                      main_cold_7();
                      return 0x47;
                    }
                  }
                }
                if (conf.pid_file != (char *)0x0) {
                  *(char *)((long)__s + -8) = -0x18;
                  *(char *)((long)__s + -7) = -0x28;
                  *(char *)((long)__s + -6) = '\x18';
                  *(char *)((long)__s + -5) = '\0';
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  pFVar12 = fopen(conf.pid_file,"wt");
                  if (pFVar12 == (FILE *)0x0) {
                    *(char *)((long)__s + -8) = -100;
                    *(char *)((long)__s + -7) = -0x26;
                    *(char *)((long)__s + -6) = '\x18';
                    *(char *)((long)__s + -5) = '\0';
                    *(char *)((long)__s + -4) = '\0';
                    *(char *)((long)__s + -3) = '\0';
                    *(char *)((long)__s + -2) = '\0';
                    *(char *)((long)__s + -1) = '\0';
                    main_cold_8();
                    return 0x47;
                  }
                  *(char *)((long)__s + -8) = -7;
                  *(char *)((long)__s + -7) = -0x28;
                  *(char *)((long)__s + -6) = '\x18';
                  *(char *)((long)__s + -5) = '\0';
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  uVar5 = getpid();
                  *(char *)((long)__s + -8) = '\f';
                  *(char *)((long)__s + -7) = -0x27;
                  *(char *)((long)__s + -6) = '\x18';
                  *(char *)((long)__s + -5) = '\0';
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  fprintf(pFVar12,"%d\n",(ulong)uVar5);
                  *(char *)((long)__s + -8) = '\x14';
                  *(char *)((long)__s + -7) = -0x27;
                  *(char *)((long)__s + -6) = '\x18';
                  *(char *)((long)__s + -5) = '\0';
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  fclose(pFVar12);
                }
                auStack_68._0_4_ = 0;
                auStack_68._4_4_ = 0;
                pcVar17 = (char *)0x0;
                parse_args.mem_set._0_4_ = 0;
                parse_args.mem_set._4_4_ = 0;
                if (conf.num_listeners != 0) {
                  sVar15 = 0;
                  pcVar17 = (char *)0x0;
                  do {
                    if ((conf.listeners[sVar15]->ssl).size != 0) {
                      sVar19 = 0;
                      do {
                        parse_args.filename = pcVar17;
                        if ((char *)CONCAT44(parse_args.mem_set._4_4_,parse_args.mem_set._0_4_) <
                            pcVar17 + 1) {
                          *(char *)((long)__s + -8) = 'u';
                          *(char *)((long)__s + -7) = -0x27;
                          *(char *)((long)__s + -6) = '\x18';
                          *(char *)((long)__s + -5) = '\0';
                          *(char *)((long)__s + -4) = '\0';
                          *(char *)((long)__s + -3) = '\0';
                          *(char *)((long)__s + -2) = '\0';
                          *(char *)((long)__s + -1) = '\0';
                          h2o_vector__expand((h2o_mem_pool_t *)0x0,(h2o_vector_t *)auStack_68,8,
                                             (size_t)(pcVar17 + 1));
                        }
                        pcVar17 = parse_args.filename + 1;
                        *(SSL_CTX **)
                         (CONCAT44(auStack_68._4_4_,auStack_68._0_4_) +
                         (long)parse_args.filename * 8) =
                             (conf.listeners[sVar15]->ssl).entries[sVar19]->ctx;
                        sVar19 = sVar19 + 1;
                      } while (sVar19 != (conf.listeners[sVar15]->ssl).size);
                    }
                    sVar15 = sVar15 + 1;
                  } while (sVar15 != conf.num_listeners);
                }
                contexts = (SSL_CTX **)CONCAT44(auStack_68._4_4_,auStack_68._0_4_);
                parse_args.filename = pcVar17;
                *(char *)((long)__s + -8) = -0x26;
                *(char *)((long)__s + -7) = -0x27;
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                ssl_setup_session_resumption(contexts,(size_t)pcVar17);
                pvVar16 = (void *)CONCAT44(auStack_68._4_4_,auStack_68._0_4_);
                *(char *)((long)__s + -8) = -0x1e;
                *(char *)((long)__s + -7) = -0x27;
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                free(pvVar16);
                *(char *)((long)__s + -8) = -0x16;
                *(char *)((long)__s + -7) = -0x27;
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                iVar6 = pipe((int *)auStack_68);
                uVar2 = auStack_68._4_4_;
                if (iVar6 != 0) {
                  *(char *)((long)__s + -8) = '.';
                  *(char *)((long)__s + -7) = -0x26;
                  *(char *)((long)__s + -6) = '\x18';
                  *(char *)((long)__s + -5) = '\0';
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  perror("pipe failed");
                  return 0x47;
                }
                *(char *)((long)__s + -8) = -7;
                *(char *)((long)__s + -7) = -0x27;
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                close(uVar2);
                uVar2 = auStack_68._0_4_;
                *(char *)((long)__s + -8) = '\x03';
                *(char *)((long)__s + -7) = -0x26;
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                dup2(uVar2,0);
                uVar2 = auStack_68._0_4_;
                *(char *)((long)__s + -8) = '\v';
                *(char *)((long)__s + -7) = -0x26;
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                close(uVar2);
                if (iVar4 == -1) {
LAB_0018da3f:
                  pFVar12 = _stderr;
                  *(char *)((long)__s + -8) = 'N';
                  *(char *)((long)__s + -7) = -0x26;
                  *(char *)((long)__s + -6) = '\x18';
                  *(char *)((long)__s + -5) = '\0';
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  uVar5 = getpid();
                  *(char *)((long)__s + -8) = 'a';
                  *(char *)((long)__s + -7) = -0x26;
                  *(char *)((long)__s + -6) = '\x18';
                  *(char *)((long)__s + -5) = '\0';
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  fprintf(pFVar12,"h2o server (pid:%d) is ready to serve requests\n",(ulong)uVar5);
                  if (conf.num_threads == 0) {
                    *(char *)((long)__s + -8) = -0x70;
                    *(char *)((long)__s + -7) = -0x26;
                    *(char *)((long)__s + -6) = '\x18';
                    *(char *)((long)__s + -5) = '\0';
                    *(char *)((long)__s + -4) = '\0';
                    *(char *)((long)__s + -3) = '\0';
                    *(char *)((long)__s + -2) = '\0';
                    *(char *)((long)__s + -1) = '\0';
                    __assert_fail("conf.num_threads != 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/src/main.c"
                                  ,0x8af,"int main(int, char **)");
                  }
                  paVar13 = (anon_struct_968_4_e2476a95 *)
                            ((long)__s + -(conf.num_threads * 0x3c8 + 0xf & 0xfffffffffffffff0));
                  paVar13[-1].memcached.cb = (h2o_multithread_receiver_cb)0x18db23;
                  conf.threads = paVar13;
                  h2o_barrier_init(&conf.startup_sync_barrier,conf.num_threads);
                  if (conf.num_threads != 1) {
                    pvVar16 = (void *)0x1;
                    do {
                      paVar13[-1].memcached.cb = (h2o_multithread_receiver_cb)0x18db4d;
                      h2o_multithread_create_thread
                                ((pthread_t *)auStack_68,(pthread_attr_t *)0x0,run_loop,pvVar16);
                      pvVar16 = (void *)((long)pvVar16 + 1);
                    } while (pvVar16 != (void *)conf.num_threads);
                  }
                  paVar13[-1].memcached.cb = (h2o_multithread_receiver_cb)0x18db60;
                  run_loop((void *)0x0);
                }
                *(char *)((long)__s + -8) = -0x35;
                *(char *)((long)__s + -7) = -0x26;
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                iVar6 = dup2(iVar4,1);
                if (iVar6 != -1) {
                  *(char *)((long)__s + -8) = -0x24;
                  *(char *)((long)__s + -7) = -0x26;
                  *(char *)((long)__s + -6) = '\x18';
                  *(char *)((long)__s + -5) = '\0';
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  iVar6 = dup2(iVar4,2);
                  if (iVar6 != -1) {
                    *(char *)((long)__s + -8) = 'g';
                    *(char *)((long)__s + -7) = -0x25;
                    *(char *)((long)__s + -6) = '\x18';
                    *(char *)((long)__s + -5) = '\0';
                    *(char *)((long)__s + -4) = '\0';
                    *(char *)((long)__s + -3) = '\0';
                    *(char *)((long)__s + -2) = '\0';
                    *(char *)((long)__s + -1) = '\0';
                    close(iVar4);
                    goto LAB_0018da3f;
                  }
                }
                *(char *)((long)__s + -8) = -0x13;
                *(char *)((long)__s + -7) = -0x26;
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                perror("dup(2) failed");
                return 0x47;
              }
            }
          }
          else if (iVar4 != 0x3a) goto LAB_0018dbc5;
LAB_0018db97:
          *(undefined8 *)((long)__s + -8) = 0x18dba1;
          exit(0x4e);
        }
        pcVar17 = _optarg;
        if (iVar4 != 99) {
          __s = &pcStack_88;
          if (iVar4 != 0x3f) {
            if (iVar4 == 0x68) {
              pcVar18 = 
              "h2o version 2.2.5\n\nUsage:\n  h2o [options]\n\nOptions:\n  -c, --conf FILE    configuration file (default: %s)\n  -m, --mode <mode>  specifies one of the following mode\n                     - worker: invoked process handles incoming connections\n                               (default)\n                     - daemon: spawns a master process and exits. `error-log`\n                               must be configured when using this mode, as all\n                               the errors are logged to the file instead of\n                               being emitted to STDERR\n                     - master: invoked process becomes a master process (using\n                               the `share/h2o/start_server` command) and spawns\n                               a worker process for handling incoming\n                               connections. Users may send SIGHUP to the master\n                               process to reconfigure or upgrade the server.\n                     - test:   tests the configuration and exits\n  -t, --test         synonym of `--mode=test`\n  -v, --version      prints the version number\n  -h, --help         print this help\n\nPlease refer to the documentation under `share/doc/h2o` (or available online at\nhttp://h2o.examp1e.net/) for how to configure the server.\n\n"
              ;
              pcVar17 = "etc/h2o.conf";
LAB_0018db84:
              pcStack_90 = (code *)0x18db8b;
              printf(pcVar18,pcVar17);
              pcStack_90 = (code *)0x18db92;
              exit(0);
            }
LAB_0018dbc5:
            pcStack_90 = (code *)0x18dbe4;
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/src/main.c"
                          ,0x802,"int main(int, char **)");
          }
          goto LAB_0018db97;
        }
      }
      if (iVar4 != 0x6d) {
        if (iVar4 != 0x74) {
          if (iVar4 == 0x76) {
            pcStack_90 = (code *)0x18dbb2;
            puts("h2o version 2.2.5");
            pcStack_90 = (code *)0x18dbb9;
            pcVar17 = (char *)OpenSSL_version(0);
            pcVar18 = "OpenSSL: %s\n";
            goto LAB_0018db84;
          }
          goto LAB_0018dbc5;
        }
        conf.run_mode = RUN_MODE_TEST;
        goto LAB_0018d37e;
      }
      pcStack_90 = (code *)0x18d3e8;
      iVar4 = strcmp(_optarg,"worker");
      if (iVar4 == 0) {
        conf.run_mode = RUN_MODE_WORKER;
      }
      else {
        pcStack_90 = (code *)0x18d3fb;
        iVar4 = strcmp(pcVar18,"master");
        if (iVar4 == 0) {
          conf.run_mode = RUN_MODE_MASTER;
        }
        else {
          pcStack_90 = (code *)0x18d40e;
          iVar4 = strcmp(pcVar18,"daemon");
          if (iVar4 == 0) {
            conf.run_mode = RUN_MODE_DAEMON;
          }
          else {
            pcStack_90 = (code *)0x18d421;
            iVar4 = strcmp(pcVar18,"test");
            if (iVar4 == 0) {
              conf.run_mode = RUN_MODE_TEST;
            }
            else {
              pcStack_90 = (code *)0x18d49d;
              fprintf(_stderr,"unknown mode:%s\n",pcVar18);
            }
          }
        }
      }
      uVar14 = (ulong)(uint)pipefds[0];
    } while (1 < conf.run_mode - RUN_MODE_MASTER);
    __s1 = "SERVER_STARTER_PORT";
    pcStack_90 = (code *)0x18d474;
    pcVar18 = getenv("SERVER_STARTER_PORT");
  } while (pcVar18 == (char *)0x0);
  pcStack_90 = set_cloexec;
  main_cold_1();
  pyVar10 = (yoml_t *)0x2;
  pcStack_98 = (code *)0x18dbfb;
  pcStack_90._0_4_ = extraout_EAX;
  iVar4 = fcntl((int)__s1,2,1);
  if (iVar4 != -1) {
    return (int)pcStack_90;
  }
  pcStack_98 = resolve_tag;
  set_cloexec_cold_1();
  pcStack_b8 = "c:m:tvh";
  poStack_c0 = main::longopts;
  pcStack_b0 = pcVar17;
  ppcStack_a8 = argv;
  uStack_a0 = uVar14;
  pcStack_98 = (code *)&stack0xfffffffffffffff8;
  iVar4 = strcmp(__s1,"!file");
  if (iVar4 == 0) {
    if (pyVar10->type != YOML_TYPE_SCALAR) {
      resolve_tag_cold_1();
      pyVar10 = (yoml_t *)0x0;
      goto LAB_0018dc2f;
    }
    pcVar17 = (pyVar10->data).scalar;
    sVar15 = vector->size;
    if (sVar15 != 0) {
      plVar20 = (long *)((long)vector->entries + 0x10);
      do {
        iVar4 = strcmp(pcVar17,(char *)plVar20[-2]);
        if (iVar4 == 0) {
          pyVar10 = (yoml_t *)*plVar20;
          pyVar10->_refcnt = pyVar10->_refcnt + 1;
          goto LAB_0018dc2f;
        }
        plVar20 = plVar20 + 3;
        sVar15 = sVar15 - 1;
      } while (sVar15 != 0);
    }
    yStack_e0.mem_set = (_func_void_ptr_void_ptr_int_size_t *)0x0;
    yStack_e0.resolve_tag.cb = resolve_tag;
    yStack_e0.filename = pcVar17;
    pyVar10 = load_config(&yStack_e0,pyVar10);
    if (pyVar10 == (yoml_t *)0x0) goto LAB_0018dc2f;
    uVar14 = vector->size + 1;
    if (vector->capacity < uVar14) {
      h2o_vector__expand((h2o_mem_pool_t *)0x0,vector,0x18,uVar14);
    }
    hVar23 = h2o_strdup((h2o_mem_pool_t *)0x0,pcVar17,0xffffffffffffffff);
    pvVar16 = vector->entries;
    sVar15 = vector->size;
    vector->size = sVar15 + 1;
    *(char **)((long)pvVar16 + sVar15 * 0x18) = hVar23.base;
    *(size_t *)((long)pvVar16 + sVar15 * 0x18 + 8) = hVar23.len;
    *(yoml_t **)((long)pvVar16 + sVar15 * 0x18 + 0x10) = pyVar10;
  }
  pyVar10->_refcnt = pyVar10->_refcnt + 1;
LAB_0018dc2f:
  return (int)pyVar10;
}

Assistant:

int main(int argc, char **argv)
{
    const char *cmd = argv[0], *opt_config_file = H2O_TO_STR(H2O_CONFIG_PATH);
    int error_log_fd = -1;

    conf.num_threads = h2o_numproc();
    conf.tfo_queues = H2O_DEFAULT_LENGTH_TCP_FASTOPEN_QUEUE;
    conf.launch_time = time(NULL);

    h2o_hostinfo_max_threads = H2O_DEFAULT_NUM_NAME_RESOLUTION_THREADS;

    h2o_sem_init(&ocsp_updater_semaphore, H2O_DEFAULT_OCSP_UPDATER_MAX_THREADS);

    init_openssl();
    setup_configurators();

    { /* parse options */
        int ch;
        static struct option longopts[] = {{"conf", required_argument, NULL, 'c'}, {"mode", required_argument, NULL, 'm'},
                                           {"test", no_argument, NULL, 't'},       {"version", no_argument, NULL, 'v'},
                                           {"help", no_argument, NULL, 'h'},       {NULL}};
        while ((ch = getopt_long(argc, argv, "c:m:tvh", longopts, NULL)) != -1) {
            switch (ch) {
            case 'c':
                opt_config_file = optarg;
                break;
            case 'm':
                if (strcmp(optarg, "worker") == 0) {
                    conf.run_mode = RUN_MODE_WORKER;
                } else if (strcmp(optarg, "master") == 0) {
                    conf.run_mode = RUN_MODE_MASTER;
                } else if (strcmp(optarg, "daemon") == 0) {
                    conf.run_mode = RUN_MODE_DAEMON;
                } else if (strcmp(optarg, "test") == 0) {
                    conf.run_mode = RUN_MODE_TEST;
                } else {
                    fprintf(stderr, "unknown mode:%s\n", optarg);
                }
                switch (conf.run_mode) {
                case RUN_MODE_MASTER:
                case RUN_MODE_DAEMON:
                    if (getenv("SERVER_STARTER_PORT") != NULL) {
                        fprintf(stderr, "refusing to start in `%s` mode, environment variable SERVER_STARTER_PORT is already set\n",
                                optarg);
                        exit(EX_SOFTWARE);
                    }
                    break;
                default:
                    break;
                }
                break;
            case 't':
                conf.run_mode = RUN_MODE_TEST;
                break;
            case 'v':
                printf("h2o version " H2O_VERSION "\n");
                printf("OpenSSL: %s\n", SSLeay_version(SSLEAY_VERSION));
#if H2O_USE_MRUBY
                printf(
                    "mruby: YES\n"); /* TODO determine the way to obtain the version of mruby (that is being linked dynamically) */
#endif
                exit(0);
            case 'h':
                printf("h2o version " H2O_VERSION "\n"
                       "\n"
                       "Usage:\n"
                       "  h2o [options]\n"
                       "\n"
                       "Options:\n"
                       "  -c, --conf FILE    configuration file (default: %s)\n"
                       "  -m, --mode <mode>  specifies one of the following mode\n"
                       "                     - worker: invoked process handles incoming connections\n"
                       "                               (default)\n"
                       "                     - daemon: spawns a master process and exits. `error-log`\n"
                       "                               must be configured when using this mode, as all\n"
                       "                               the errors are logged to the file instead of\n"
                       "                               being emitted to STDERR\n"
                       "                     - master: invoked process becomes a master process (using\n"
                       "                               the `share/h2o/start_server` command) and spawns\n"
                       "                               a worker process for handling incoming\n"
                       "                               connections. Users may send SIGHUP to the master\n"
                       "                               process to reconfigure or upgrade the server.\n"
                       "                     - test:   tests the configuration and exits\n"
                       "  -t, --test         synonym of `--mode=test`\n"
                       "  -v, --version      prints the version number\n"
                       "  -h, --help         print this help\n"
                       "\n"
                       "Please refer to the documentation under `share/doc/h2o` (or available online at\n"
                       "http://h2o.examp1e.net/) for how to configure the server.\n"
                       "\n",
                       H2O_TO_STR(H2O_CONFIG_PATH));
                exit(0);
                break;
            case ':':
            case '?':
                exit(EX_CONFIG);
            default:
                assert(0);
                break;
            }
        }
        argc -= optind;
        argv += optind;
    }

    /* setup conf.server_starter */
    if ((conf.server_starter.num_fds = h2o_server_starter_get_fds(&conf.server_starter.fds)) == SIZE_MAX)
        exit(EX_CONFIG);
    if (conf.server_starter.fds != 0) {
        size_t i;
        for (i = 0; i != conf.server_starter.num_fds; ++i)
            set_cloexec(conf.server_starter.fds[i]);
        conf.server_starter.bound_fd_map = alloca(conf.server_starter.num_fds);
        memset(conf.server_starter.bound_fd_map, 0, conf.server_starter.num_fds);
        conf.server_starter.env_var = getenv("SERVER_STARTER_PORT");
    }
    unsetenv("SERVER_STARTER_PORT");

    { /* configure */
        yoml_t *yoml;
        resolve_tag_arg_t resolve_tag_arg = {{NULL}};
        yoml_parse_args_t parse_args = {
            opt_config_file,                /* filename */
            NULL,                           /* mem_set */
            {resolve_tag, &resolve_tag_arg} /* resolve_tag */
        };
        if ((yoml = load_config(&parse_args, NULL)) == NULL)
            exit(EX_CONFIG);
        if (h2o_configurator_apply(&conf.globalconf, yoml, conf.run_mode != RUN_MODE_WORKER) != 0)
            exit(EX_CONFIG);

        dispose_resolve_tag_arg(&resolve_tag_arg);
        yoml_free(yoml, NULL);
    }
    /* calculate defaults (note: open file cached is purged once every loop) */
    conf.globalconf.filecache.capacity = conf.globalconf.http2.max_concurrent_requests_per_connection * 2;

    /* check if all the fds passed in by server::starter were bound */
    if (conf.server_starter.fds != NULL) {
        size_t i;
        int all_were_bound = 1;
        for (i = 0; i != conf.server_starter.num_fds; ++i) {
            if (!conf.server_starter.bound_fd_map[i]) {
                fprintf(stderr, "no configuration found for fd:%d passed in by $SERVER_STARTER_PORT\n", conf.server_starter.fds[i]);
                all_were_bound = 0;
            }
        }
        if (!all_were_bound) {
            fprintf(stderr, "note: $SERVER_STARTER_PORT was \"%s\"\n", conf.server_starter.env_var);
            return EX_CONFIG;
        }
    }

    h2o_srand();
    /* handle run_mode == MASTER|TEST */
    switch (conf.run_mode) {
    case RUN_MODE_WORKER:
        break;
    case RUN_MODE_DAEMON:
        if (conf.error_log == NULL) {
            fprintf(stderr, "to run in `daemon` mode, `error-log` must be specified in the configuration file\n");
            return EX_CONFIG;
        }
        return run_using_server_starter(cmd, opt_config_file);
    case RUN_MODE_MASTER:
        return run_using_server_starter(cmd, opt_config_file);
    case RUN_MODE_TEST:
        printf("configuration OK\n");
        return 0;
    }

    if (getenv("H2O_VIA_MASTER") != NULL) {
        /* pid_file and error_log are the directives that are handled by the master process (invoking start_server) */
        conf.pid_file = NULL;
        conf.error_log = NULL;
    }

    { /* raise RLIMIT_NOFILE */
        struct rlimit limit;
        if (getrlimit(RLIMIT_NOFILE, &limit) == 0) {
            limit.rlim_cur = limit.rlim_max;
            if (setrlimit(RLIMIT_NOFILE, &limit) == 0
#ifdef __APPLE__
                || (limit.rlim_cur = OPEN_MAX, setrlimit(RLIMIT_NOFILE, &limit)) == 0
#endif
                ) {
                fprintf(stderr, "[INFO] raised RLIMIT_NOFILE to %d\n", (int)limit.rlim_cur);
            }
        }
    }

    setup_signal_handlers();

    /* open the log file to redirect STDIN/STDERR to, before calling setuid */
    if (conf.error_log != NULL) {
        if ((error_log_fd = h2o_access_log_open_log(conf.error_log)) == -1)
            return EX_CONFIG;
    }
    setvbuf(stdout, NULL, _IOLBF, 0);
    setvbuf(stderr, NULL, _IOLBF, 0);

    /* setuid */
    if (conf.globalconf.user != NULL) {
        if (h2o_setuidgid(conf.globalconf.user) != 0) {
            fprintf(stderr, "failed to change the running user (are you sure you are running as root?)\n");
            return EX_OSERR;
        }
        if (neverbleed != NULL && neverbleed_setuidgid(neverbleed, conf.globalconf.user, 1) != 0) {
            fprintf(stderr, "failed to change the running user of neverbleed daemon\n");
            return EX_OSERR;
        }
    } else {
        if (getuid() == 0) {
            fprintf(stderr, "refusing to run as root (and failed to switch to `nobody`); you can use the `user` directive to set "
                            "the running user\n");
            return EX_CONFIG;
        }
    }

    /* pid file must be written after setuid, since we need to remove it  */
    if (conf.pid_file != NULL) {
        FILE *fp = fopen(conf.pid_file, "wt");
        if (fp == NULL) {
            fprintf(stderr, "failed to open pid file:%s:%s\n", conf.pid_file, strerror(errno));
            return EX_OSERR;
        }
        fprintf(fp, "%d\n", (int)getpid());
        fclose(fp);
    }

    { /* initialize SSL_CTXs for session resumption and ticket-based resumption (also starts memcached client threads for the
         purpose) */
        size_t i, j;
        H2O_VECTOR(SSL_CTX *) ssl_contexts = {NULL};
        for (i = 0; i != conf.num_listeners; ++i) {
            for (j = 0; j != conf.listeners[i]->ssl.size; ++j) {
                h2o_vector_reserve(NULL, &ssl_contexts, ssl_contexts.size + 1);
                ssl_contexts.entries[ssl_contexts.size++] = conf.listeners[i]->ssl.entries[j]->ctx;
            }
        }
        ssl_setup_session_resumption(ssl_contexts.entries, ssl_contexts.size);
        free(ssl_contexts.entries);
    }

    /* all setup should be complete by now */

    /* replace STDIN to an closed pipe */
    {
        int fds[2];
        if (pipe(fds) != 0) {
            perror("pipe failed");
            return EX_OSERR;
        }
        close(fds[1]);
        dup2(fds[0], 0);
        close(fds[0]);
    }

    /* redirect STDOUT and STDERR to error_log (if specified) */
    if (error_log_fd != -1) {
        if (dup2(error_log_fd, 1) == -1 || dup2(error_log_fd, 2) == -1) {
            perror("dup(2) failed");
            return EX_OSERR;
        }
        close(error_log_fd);
        error_log_fd = -1;
    }

    fprintf(stderr, "h2o server (pid:%d) is ready to serve requests\n", (int)getpid());

    assert(conf.num_threads != 0);

    /* start the threads */
    conf.threads = alloca(sizeof(conf.threads[0]) * conf.num_threads);
    h2o_barrier_init(&conf.startup_sync_barrier, conf.num_threads);
    size_t i;
    for (i = 1; i != conf.num_threads; ++i) {
        pthread_t tid;
        h2o_multithread_create_thread(&tid, NULL, run_loop, (void *)i);
    }

    /* this thread becomes the first thread */
    run_loop((void *)0);

    /* notreached */
    return 0;
}